

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

ExpEmit __thiscall FxATan2::Emit(FxATan2 *this,VMFunctionBuilder *build)

{
  uint uVar1;
  ExpEmit EVar2;
  ExpEmit EVar3;
  FxATan2 *this_00;
  ExpEmit xreg;
  ExpEmit yreg;
  
  this_00 = this;
  EVar2 = ToReg(this,build,this->yval);
  yreg = EVar2;
  EVar3 = ToReg(this_00,build,this->xval);
  xreg = EVar3;
  ExpEmit::Free(&yreg,build);
  ExpEmit::Free(&xreg,build);
  uVar1 = VMFunctionBuilder::RegAvailability::Get(build->Registers + 1,1);
  VMFunctionBuilder::Emit(build,0xab,uVar1 & 0xffff,EVar2._0_4_ & 0xffff,EVar3._0_4_ & 0xffff);
  EVar2._0_4_ = uVar1 & 0xffff | 0x1010000;
  EVar2.Konst = false;
  EVar2.Fixed = false;
  EVar2.Final = false;
  EVar2.Target = false;
  return EVar2;
}

Assistant:

ExpEmit FxATan2::Emit(VMFunctionBuilder *build)
{
	ExpEmit yreg = ToReg(build, yval);
	ExpEmit xreg = ToReg(build, xval);
	yreg.Free(build);
	xreg.Free(build);
	ExpEmit out(build, REGT_FLOAT);
	build->Emit(OP_ATAN2, out.RegNum, yreg.RegNum, xreg.RegNum);
	return out;
}